

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void xmlVFormatLegacyError(void *ctx,char *level,char *fmt,__va_list_tag *ap)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlParserInputPtr input;
  xmlParserInputPtr input_00;
  xmlChar *str;
  xmlChar *local_40;
  __va_list_tag *local_38;
  
  local_40 = (xmlChar *)0x0;
  local_38 = ap;
  if (ctx == (void *)0x0) {
    input_00 = (xmlParserInputPtr)0x0;
    input = (xmlParserInputPtr)0x0;
    goto LAB_0012ffc9;
  }
  input = *(xmlParserInputPtr *)((long)ctx + 0x38);
  if (input == (xmlParserInputPtr)0x0) {
    input_00 = (xmlParserInputPtr)0x0;
LAB_0012ffbf:
    input = (xmlParserInputPtr)0x0;
  }
  else {
    input_00 = input;
    if ((input->filename != (char *)0x0) || ((long)*(int *)((long)ctx + 0x40) < 2))
    goto LAB_0012ffbf;
    input_00 = *(xmlParserInputPtr *)
                (*(long *)((long)ctx + 0x48) + -0x10 + (long)*(int *)((long)ctx + 0x40) * 8);
  }
  xmlParserPrintFileInfo(input_00);
LAB_0012ffc9:
  pp_Var2 = __xmlGenericError();
  p_Var1 = *pp_Var2;
  ppvVar3 = __xmlGenericErrorContext();
  (*p_Var1)(*ppvVar3,"%s: ",level);
  xmlStrVASPrintf(&local_40,64000,fmt,local_38);
  if (local_40 != (xmlChar *)0x0) {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"%s",local_40);
    (*xmlFree)(local_40);
  }
  if ((ctx != (void *)0x0) && (xmlParserPrintFileContext(input_00), input != (xmlParserInputPtr)0x0)
     ) {
    xmlParserPrintFileInfo(input);
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"\n");
    xmlParserPrintFileContext(input);
  }
  return;
}

Assistant:

static void
xmlVFormatLegacyError(void *ctx, const char *level,
                      const char *fmt, va_list ap) {
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;
    xmlChar *str = NULL;

    if (ctxt != NULL) {
	input = ctxt->input;
	if ((input != NULL) && (input->filename == NULL) &&
	    (ctxt->inputNr > 1)) {
	    cur = input;
	    input = ctxt->inputTab[ctxt->inputNr - 2];
	}
	xmlParserPrintFileInfo(input);
    }

    xmlGenericError(xmlGenericErrorContext, "%s: ", level);

    xmlStrVASPrintf(&str, MAX_ERR_MSG_SIZE, fmt, ap);
    if (str != NULL) {
        xmlGenericError(xmlGenericErrorContext, "%s", (char *) str);
	xmlFree(str);
    }

    if (ctxt != NULL) {
	xmlParserPrintFileContext(input);
	if (cur != NULL) {
	    xmlParserPrintFileInfo(cur);
	    xmlGenericError(xmlGenericErrorContext, "\n");
	    xmlParserPrintFileContext(cur);
	}
    }
}